

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v7::detail::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  int *this;
  char *pcVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  type tVar6;
  uint uVar7;
  uint64_t value_00;
  long lVar8;
  int iVar9;
  undefined1 local_330 [8];
  bigint upper_store;
  bigint lower;
  bigint numerator;
  bigint denominator;
  undefined1 local_58 [8];
  fp value;
  bigint *local_38;
  
  numerator.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  lower._168_8_ = &PTR_grow_002bdc80;
  numerator.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&numerator.bigits_.super_buffer<unsigned_int>.capacity_;
  numerator.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  numerator.bigits_._160_4_ = 0;
  denominator.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  numerator._168_8_ = &PTR_grow_002bdc80;
  denominator.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&denominator.bigits_.super_buffer<unsigned_int>.capacity_;
  denominator.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  denominator.bigits_._160_4_ = 0;
  lower.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  upper_store._168_8_ = &PTR_grow_002bdc80;
  lower.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&lower.bigits_.super_buffer<unsigned_int>.capacity_;
  lower.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  lower.bigits_._160_4_ = 0;
  local_38 = (bigint *)local_330;
  upper_store.bigits_.super_buffer<unsigned_int>.ptr_ = (uint *)0x0;
  local_330 = (undefined1  [8])&PTR_grow_002bdc80;
  upper_store.bigits_.super_buffer<unsigned_int>._vptr_buffer =
       (_func_int **)&upper_store.bigits_.super_buffer<unsigned_int>.capacity_;
  upper_store.bigits_.super_buffer<unsigned_int>.size_ = 0x20;
  upper_store.bigits_._160_4_ = 0;
  local_58 = (undefined1  [8])0x0;
  value.f._0_4_ = 0;
  value._8_8_ = exp10;
  bVar2 = fp::assign<double,_0>((fp *)local_58,d);
  iVar9 = bVar2 + 1;
  value_00 = (long)local_58 << (sbyte)iVar9;
  if ((int)value.f < 0) {
    if (*(int *)value._8_8_ < 0) {
      bigint::assign_pow10((bigint *)&lower.exp_,-*(int *)value._8_8_);
      bigint::assign((bigint *)&upper_store.exp_,(bigint *)&lower.exp_);
      if (bVar2) {
        local_38 = (bigint *)local_330;
        bigint::assign(local_38,(bigint *)&lower.exp_);
        bigint::operator<<=((bigint *)local_330,1);
      }
      else {
        local_38 = (bigint *)0x0;
      }
      bigint::operator*=((bigint *)&lower.exp_,value_00);
      bigint::assign((bigint *)&numerator.exp_,1);
      bigint::operator<<=((bigint *)&numerator.exp_,iVar9 - (int)value.f);
    }
    else {
      bigint::assign((bigint *)&lower.exp_,value_00);
      bigint::assign_pow10((bigint *)&numerator.exp_,*(int *)value._8_8_);
      bigint::operator<<=((bigint *)&numerator.exp_,iVar9 - (int)value.f);
      bigint::assign((bigint *)&upper_store.exp_,1);
      if (bVar2) {
        bigint::assign((bigint *)local_330,2);
      }
      else {
        local_38 = (bigint *)0x0;
      }
    }
  }
  else {
    bigint::assign((bigint *)&lower.exp_,value_00);
    bigint::operator<<=((bigint *)&lower.exp_,(int)value.f);
    bigint::assign((bigint *)&upper_store.exp_,1);
    bigint::operator<<=((bigint *)&upper_store.exp_,(int)value.f);
    if (bVar2) {
      local_38 = (bigint *)local_330;
      bigint::assign(local_38,1);
      bigint::operator<<=((bigint *)local_330,(int)value.f + 1);
    }
    else {
      local_38 = (bigint *)0x0;
    }
    bigint::assign_pow10((bigint *)&numerator.exp_,*(int *)value._8_8_);
    bigint::operator<<=((bigint *)&numerator.exp_,1);
  }
  denominator._168_8_ = local_38;
  if (local_38 == (bigint *)0x0) {
    denominator._168_8_ = &upper_store.exp_;
  }
  pcVar1 = buf->ptr_;
  uVar7 = ~local_58._0_4_ & 1;
  lVar8 = 0;
  this = &lower.exp_;
  while( true ) {
    uVar4 = bigint::divmod_assign((bigint *)this,(bigint *)&numerator.exp_);
    iVar9 = compare((bigint *)this,(bigint *)&upper_store.exp_);
    iVar5 = add_compare((bigint *)this,(bigint *)denominator._168_8_,(bigint *)&numerator.exp_);
    pcVar1[lVar8] = (char)uVar4 + '0';
    if ((iVar9 < (int)uVar7) || ((int)-uVar7 < iVar5)) break;
    bigint::multiply((bigint *)this,10);
    bigint::multiply((bigint *)&upper_store.exp_,10);
    if (local_38 != (bigint *)0x0) {
      bigint::multiply(local_38,10);
    }
    lVar8 = lVar8 + 1;
  }
  if (iVar9 < (int)uVar7) {
    if (iVar5 <= (int)-uVar7) goto LAB_002137a0;
    iVar9 = add_compare((bigint *)&lower.exp_,(bigint *)&lower.exp_,(bigint *)&numerator.exp_);
    if ((iVar9 < 1) && ((uVar4 & 1) == 0 || iVar9 != 0)) goto LAB_002137a0;
    cVar3 = pcVar1[lVar8] + '\x01';
  }
  else {
    cVar3 = (char)uVar4 + '1';
  }
  pcVar1[lVar8] = cVar3;
LAB_002137a0:
  tVar6 = to_unsigned<int>((int)lVar8 + 1);
  buffer<char>::try_resize(buf,(ulong)tVar6);
  *(int *)value._8_8_ = *(int *)value._8_8_ - (int)lVar8;
  bigint::~bigint((bigint *)local_330);
  bigint::~bigint((bigint *)&upper_store.exp_);
  bigint::~bigint((bigint *)&numerator.exp_);
  bigint::~bigint((bigint *)&lower.exp_);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.try_resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}